

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long row;
  TPZFMatrix<double> *pTVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  REAL value;
  double local_60;
  double local_58;
  REAL x_local;
  TPZFMatrix<double> *local_48;
  double local_40;
  double local_38;
  
  if (0 < num) {
    value = 1.0;
    x_local = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&value);
    value = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&value);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&x_local);
      value = 1.0;
      local_48 = dphi;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      lVar4 = (ulong)(uint)num - 2;
      lVar3 = 2;
      while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
        local_38 = (double)(int)lVar3;
        row = lVar3 + -1;
        local_40 = (double)(int)row;
        local_58 = local_40 + local_40 + 1.0;
        local_60 = x_local * local_58;
        pdVar2 = TPZFMatrix<double>::operator()(phi,row,0);
        local_60 = local_60 * *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(phi,lVar3 + -2,0);
        value = (local_60 - local_40 * *pdVar2) / local_38;
        (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20]
        )(phi,lVar3,0,&value);
        pdVar2 = TPZFMatrix<double>::operator()(phi,row,0);
        pTVar1 = local_48;
        local_58 = local_58 * *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(local_48,0,lVar3 + -2);
        value = local_58 + *pdVar2;
        (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(pTVar1,0,lVar3,&value);
        lVar3 = lVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}